

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_v4dwt_decode(opj_v4dwt_t *dwt)

{
  opj_v4_t *w;
  OPJ_INT32 count;
  OPJ_INT32 count_00;
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  float *pfVar9;
  opj_v4_t *poVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  opj_v4_t *poVar15;
  int iVar16;
  opj_v4_t *w_00;
  undefined4 in_XMM1_Da;
  OPJ_FLOAT32 OVar17;
  undefined4 in_XMM1_Db;
  OPJ_FLOAT32 OVar18;
  OPJ_FLOAT32 OVar19;
  OPJ_FLOAT32 OVar20;
  __m128 c;
  __m128 c_00;
  
  if (dwt->cas == 0) {
    iVar14 = 1;
    iVar12 = 0;
    if (0 < dwt->dn) goto LAB_00109e9e;
    iVar11 = dwt->sn;
    iVar12 = 0;
  }
  else {
    iVar14 = 0;
    iVar12 = 1;
    if (0 < dwt->sn) goto LAB_00109e9e;
    iVar11 = dwt->dn;
    iVar14 = 0;
  }
  if (iVar11 < 2) {
    return;
  }
LAB_00109e9e:
  poVar10 = dwt->wavelet;
  w = (opj_v4_t *)((long)poVar10 + (ulong)(uint)(iVar12 << 4));
  count = dwt->sn;
  c[3] = (float)in_XMM1_Db;
  c[2] = (float)in_XMM1_Da;
  c[0] = 1.2301741;
  c[1] = 1.2301741;
  opj_v4dwt_decode_step1_sse(w,count,c);
  w_00 = (opj_v4_t *)((ulong)(uint)(iVar14 << 4) + (long)poVar10);
  count_00 = dwt->dn;
  c_00[3] = (float)in_XMM1_Db;
  c_00[2] = (float)in_XMM1_Da;
  c_00[0] = 1.6257324;
  c_00[1] = 1.6257324;
  opj_v4dwt_decode_step1_sse(w_00,count_00,c_00);
  pfVar8 = (float *)((long)poVar10 + (ulong)(uint)(iVar12 << 4) + 0x10);
  iVar12 = count_00 - iVar12;
  iVar11 = iVar12;
  if (count < iVar12) {
    iVar11 = count;
  }
  pfVar9 = pfVar8;
  if (0 < iVar11) {
    OVar17 = w_00->f[0];
    OVar18 = w_00->f[1];
    OVar19 = w_00->f[2];
    OVar20 = w_00->f[3];
    iVar13 = iVar11;
    do {
      fVar1 = *pfVar9;
      pfVar2 = pfVar9 + 1;
      pfVar3 = pfVar9 + 2;
      pfVar4 = pfVar9 + 3;
      pfVar9[-4] = ((float)OVar17 + fVar1) * -0.44350687 + pfVar9[-4];
      pfVar9[-3] = ((float)OVar18 + *pfVar2) * -0.44350687 + pfVar9[-3];
      pfVar9[-2] = ((float)OVar19 + *pfVar3) * -0.44350687 + pfVar9[-2];
      pfVar9[-1] = ((float)OVar20 + *pfVar4) * -0.44350687 + pfVar9[-1];
      pfVar9 = pfVar9 + 8;
      iVar13 = iVar13 + -1;
      OVar17 = (OPJ_FLOAT32)fVar1;
      OVar18 = (OPJ_FLOAT32)*pfVar2;
      OVar19 = (OPJ_FLOAT32)*pfVar3;
      OVar20 = (OPJ_FLOAT32)*pfVar4;
    } while (iVar13 != 0);
  }
  if (iVar12 < count) {
    fVar1 = pfVar9[-8];
    fVar5 = pfVar9[-7];
    fVar6 = pfVar9[-6];
    fVar7 = pfVar9[-5];
    iVar13 = count - iVar11;
    pfVar9 = pfVar9 + -4;
    do {
      *pfVar9 = *pfVar9 - fVar1 * 0.88701373;
      pfVar9[1] = pfVar9[1] - fVar5 * 0.88701373;
      pfVar9[2] = pfVar9[2] - fVar6 * 0.88701373;
      pfVar9[3] = pfVar9[3] - fVar7 * 0.88701373;
      pfVar9 = pfVar9 + 8;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  poVar10 = w_00 + 1;
  iVar14 = count - iVar14;
  iVar13 = iVar14;
  if (count_00 < iVar14) {
    iVar13 = count_00;
  }
  poVar15 = poVar10;
  if (0 < iVar13) {
    OVar17 = w->f[0];
    OVar18 = w->f[1];
    OVar19 = w->f[2];
    OVar20 = w->f[3];
    iVar16 = iVar13;
    do {
      fVar1 = (float)poVar15->f[0];
      pfVar9 = (float *)(poVar15->f + 1);
      pfVar2 = (float *)(poVar15->f + 2);
      pfVar3 = (float *)(poVar15->f + 3);
      poVar15[-1].f[0] =
           (OPJ_FLOAT32)(((float)OVar17 + fVar1) * -0.8829111 + (float)poVar15[-1].f[0]);
      *(float *)((long)poVar15 + -0xc) =
           ((float)OVar18 + *pfVar9) * -0.8829111 + *(float *)((long)poVar15 + -0xc);
      *(float *)((long)poVar15 + -8) =
           ((float)OVar19 + *pfVar2) * -0.8829111 + *(float *)((long)poVar15 + -8);
      *(float *)((long)poVar15 + -4) =
           ((float)OVar20 + *pfVar3) * -0.8829111 + *(float *)((long)poVar15 + -4);
      poVar15 = poVar15 + 2;
      iVar16 = iVar16 + -1;
      OVar17 = (OPJ_FLOAT32)fVar1;
      OVar18 = (OPJ_FLOAT32)*pfVar9;
      OVar19 = (OPJ_FLOAT32)*pfVar2;
      OVar20 = (OPJ_FLOAT32)*pfVar3;
    } while (iVar16 != 0);
  }
  if (iVar14 < count_00) {
    fVar1 = (float)poVar15[-2].f[0];
    fVar5 = *(float *)((long)poVar15 + -0x1c);
    fVar6 = *(float *)((long)poVar15 + -0x18);
    fVar7 = *(float *)((long)poVar15 + -0x14);
    iVar16 = count_00 - iVar13;
    poVar15 = poVar15 + -1;
    do {
      poVar15->f[0] = (OPJ_FLOAT32)((float)poVar15->f[0] - fVar1 * 1.7658222);
      poVar15->f[1] = (OPJ_FLOAT32)((float)poVar15->f[1] - fVar5 * 1.7658222);
      poVar15->f[2] = (OPJ_FLOAT32)((float)poVar15->f[2] - fVar6 * 1.7658222);
      poVar15->f[3] = (OPJ_FLOAT32)((float)poVar15->f[3] - fVar7 * 1.7658222);
      poVar15 = poVar15 + 2;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  if (0 < iVar11) {
    OVar17 = w_00->f[0];
    OVar18 = w_00->f[1];
    OVar19 = w_00->f[2];
    OVar20 = w_00->f[3];
    iVar16 = iVar11;
    do {
      fVar1 = *pfVar8;
      pfVar9 = pfVar8 + 1;
      pfVar2 = pfVar8 + 2;
      pfVar3 = pfVar8 + 3;
      pfVar8[-4] = ((float)OVar17 + fVar1) * 0.052980117 + pfVar8[-4];
      pfVar8[-3] = ((float)OVar18 + *pfVar9) * 0.052980117 + pfVar8[-3];
      pfVar8[-2] = ((float)OVar19 + *pfVar2) * 0.052980117 + pfVar8[-2];
      pfVar8[-1] = ((float)OVar20 + *pfVar3) * 0.052980117 + pfVar8[-1];
      pfVar8 = pfVar8 + 8;
      iVar16 = iVar16 + -1;
      OVar17 = (OPJ_FLOAT32)fVar1;
      OVar18 = (OPJ_FLOAT32)*pfVar9;
      OVar19 = (OPJ_FLOAT32)*pfVar2;
      OVar20 = (OPJ_FLOAT32)*pfVar3;
    } while (iVar16 != 0);
  }
  if (iVar12 < count) {
    fVar1 = pfVar8[-8];
    fVar5 = pfVar8[-7];
    fVar6 = pfVar8[-6];
    fVar7 = pfVar8[-5];
    iVar11 = count - iVar11;
    pfVar8 = pfVar8 + -4;
    do {
      *pfVar8 = *pfVar8 + fVar1 * 0.105960235;
      pfVar8[1] = pfVar8[1] + fVar5 * 0.105960235;
      pfVar8[2] = pfVar8[2] + fVar6 * 0.105960235;
      pfVar8[3] = pfVar8[3] + fVar7 * 0.105960235;
      pfVar8 = pfVar8 + 8;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  if (0 < iVar13) {
    OVar17 = w->f[0];
    OVar18 = w->f[1];
    OVar19 = w->f[2];
    OVar20 = w->f[3];
    iVar12 = iVar13;
    do {
      fVar1 = (float)poVar10->f[0];
      pfVar8 = (float *)(poVar10->f + 1);
      pfVar9 = (float *)(poVar10->f + 2);
      pfVar2 = (float *)(poVar10->f + 3);
      poVar10[-1].f[0] =
           (OPJ_FLOAT32)(((float)OVar17 + fVar1) * 1.5861343 + (float)poVar10[-1].f[0]);
      *(float *)((long)poVar10 + -0xc) =
           ((float)OVar18 + *pfVar8) * 1.5861343 + *(float *)((long)poVar10 + -0xc);
      *(float *)((long)poVar10 + -8) =
           ((float)OVar19 + *pfVar9) * 1.5861343 + *(float *)((long)poVar10 + -8);
      *(float *)((long)poVar10 + -4) =
           ((float)OVar20 + *pfVar2) * 1.5861343 + *(float *)((long)poVar10 + -4);
      poVar10 = poVar10 + 2;
      iVar12 = iVar12 + -1;
      OVar17 = (OPJ_FLOAT32)fVar1;
      OVar18 = (OPJ_FLOAT32)*pfVar8;
      OVar19 = (OPJ_FLOAT32)*pfVar9;
      OVar20 = (OPJ_FLOAT32)*pfVar2;
    } while (iVar12 != 0);
  }
  if (iVar14 < count_00) {
    fVar1 = (float)poVar10[-2].f[0];
    fVar5 = *(float *)((long)poVar10 + -0x1c);
    fVar6 = *(float *)((long)poVar10 + -0x18);
    fVar7 = *(float *)((long)poVar10 + -0x14);
    iVar13 = count_00 - iVar13;
    poVar10 = poVar10 + -1;
    do {
      poVar10->f[0] = (OPJ_FLOAT32)((float)poVar10->f[0] + fVar1 * 3.1722686);
      poVar10->f[1] = (OPJ_FLOAT32)((float)poVar10->f[1] + fVar5 * 3.1722686);
      poVar10->f[2] = (OPJ_FLOAT32)((float)poVar10->f[2] + fVar6 * 3.1722686);
      poVar10->f[3] = (OPJ_FLOAT32)((float)poVar10->f[3] + fVar7 * 3.1722686);
      poVar10 = poVar10 + 2;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  return;
}

Assistant:

static void opj_v4dwt_decode(opj_v4dwt_t* OPJ_RESTRICT dwt)
{
	OPJ_INT32 a, b;
	if(dwt->cas == 0) {
		if(!((dwt->dn > 0) || (dwt->sn > 1))){
			return;
		}
		a = 0;
		b = 1;
	}else{
		if(!((dwt->sn > 0) || (dwt->dn > 1))) {
			return;
		}
		a = 1;
		b = 0;
	}
#ifdef __SSE__
	opj_v4dwt_decode_step1_sse(dwt->wavelet+a, dwt->sn, _mm_set1_ps(opj_K));
	opj_v4dwt_decode_step1_sse(dwt->wavelet+b, dwt->dn, _mm_set1_ps(opj_c13318));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), _mm_set1_ps(opj_dwt_delta));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), _mm_set1_ps(opj_dwt_gamma));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), _mm_set1_ps(opj_dwt_beta));
	opj_v4dwt_decode_step2_sse(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), _mm_set1_ps(opj_dwt_alpha));
#else
	opj_v4dwt_decode_step1(dwt->wavelet+a, dwt->sn, opj_K);
	opj_v4dwt_decode_step1(dwt->wavelet+b, dwt->dn, opj_c13318);
	opj_v4dwt_decode_step2(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), opj_dwt_delta);
	opj_v4dwt_decode_step2(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), opj_dwt_gamma);
	opj_v4dwt_decode_step2(dwt->wavelet+b, dwt->wavelet+a+1, dwt->sn, opj_int_min(dwt->sn, dwt->dn-a), opj_dwt_beta);
	opj_v4dwt_decode_step2(dwt->wavelet+a, dwt->wavelet+b+1, dwt->dn, opj_int_min(dwt->dn, dwt->sn-b), opj_dwt_alpha);
#endif
}